

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::LayerNormalizationLayerParams::ByteSizeLong
          (LayerNormalizationLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  LayerNormalizationLayerParams *this_local;
  
  data_size = 0;
  sVar3 = google::protobuf::internal::WireFormatLite::Int64Size(&this->normalizedshape_);
  if (sVar3 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_normalizedshape_cached_byte_size_ = iVar2;
  data_size = sVar3 + data_size;
  bVar1 = has_gamma(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->gamma_);
    data_size = sVar3 + 1 + data_size;
  }
  bVar1 = has_beta(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->beta_);
    data_size = sVar3 + 1 + data_size;
  }
  fVar5 = eps(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    data_size = data_size + 5;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t LayerNormalizationLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LayerNormalizationLayerParams)
  size_t total_size = 0;

  // repeated int64 normalizedShape = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->normalizedshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _normalizedshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams gamma = 3;
  if (this->has_gamma()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->gamma_);
  }

  // .CoreML.Specification.WeightParams beta = 4;
  if (this->has_beta()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->beta_);
  }

  // float eps = 2;
  if (this->eps() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}